

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O0

void __thiscall UtxoUtil_ConvertToUtxo_Test::TestBody(UtxoUtil_ConvertToUtxo_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uchar *__s2;
  char *pcVar4;
  char *rhs;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  UtxoData dest;
  Utxo utxo;
  UtxoData utxo1;
  bool *in_stack_fffffffffffff318;
  UtxoData *in_stack_fffffffffffff320;
  undefined7 in_stack_fffffffffffff328;
  undefined1 in_stack_fffffffffffff32f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff330;
  undefined7 in_stack_fffffffffffff338;
  undefined1 in_stack_fffffffffffff33f;
  UtxoData *in_stack_fffffffffffff380;
  UtxoData *this_00;
  AssertHelper local_c78;
  Message local_c70;
  AssertionResult local_c68;
  AssertHelper local_c58;
  Message local_c50;
  ByteData local_c48;
  string local_c30;
  ByteData local_c10;
  string local_bf8;
  AssertionResult local_bd8;
  AssertHelper local_bc8;
  Message local_bc0;
  AssertionResult local_bb8;
  string local_ba8;
  AssertHelper local_b88;
  Message local_b80;
  ByteData local_b78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b60;
  undefined1 local_b41;
  AssertionResult local_b40;
  AssertHelper local_b30;
  Message local_b28 [7];
  Txid local_af0 [38];
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  allocator<char> local_539;
  string local_538;
  Txid local_518 [2];
  Txid local_4d0;
  undefined4 local_4b0;
  undefined4 local_290;
  UtxoData *in_stack_ffffffffffffffa0;
  Utxo *in_stack_ffffffffffffffa8;
  UtxoData *in_stack_ffffffffffffffb0;
  
  cfd::UtxoData::UtxoData(in_stack_fffffffffffff380);
  this_00 = (UtxoData *)&local_539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,(allocator *)this_00);
  cfd::core::Txid::Txid(local_518,&local_538);
  cfd::core::Txid::operator=(&local_4d0,local_518);
  cfd::core::Txid::~Txid((Txid *)0x287aa4);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  local_4b0 = 1;
  local_290 = 4;
  local_568 = 0;
  uStack_560 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_588 = 0;
  uStack_580 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_5b8 = 0;
  uStack_5b0 = 0;
  local_5c8 = 0;
  uStack_5c0 = 0;
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5e8 = 0;
  uStack_5e0 = 0;
  local_5f8 = 0;
  uStack_5f0 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_628 = 0;
  uStack_620 = 0;
  local_558 = 0;
  cfd::UtxoData::UtxoData(this_00);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::UtxoUtil::ConvertToUtxo
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  else {
    testing::Message::Message(local_b28);
    testing::internal::AssertHelper::AssertHelper
              (&local_b30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x37,
               "Expected: (UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b30,local_b28);
    testing::internal::AssertHelper::~AssertHelper(&local_b30);
    testing::Message::~Message((Message *)0x287cf6);
  }
  cfd::core::Txid::GetData(&local_b78,&local_4d0);
  cfd::core::ByteData::GetBytes(&local_b60,&local_b78);
  __s2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x287d89);
  iVar3 = memcmp(&uStack_600,__s2,0x20);
  local_b41 = iVar3 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff320,in_stack_fffffffffffff318,(type *)0x287dbe
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffff330);
  cfd::core::ByteData::~ByteData((ByteData *)0x287dda);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b40);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ba8,(internal *)&local_b40,
               (AssertionResult *)
               "(memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0)"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x38,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b88,&local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    std::__cxx11::string::~string((string *)&local_ba8);
    testing::Message::~Message((Message *)0x287f07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x287f7f);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
             (char *)in_stack_fffffffffffff330,
             (uint *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (uint *)in_stack_fffffffffffff320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x288015);
    testing::internal::AssertHelper::AssertHelper
              (&local_bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x39,pcVar4);
    testing::internal::AssertHelper::operator=(&local_bc8,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper(&local_bc8);
    testing::Message::~Message((Message *)0x288072);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2880ca);
  cfd::core::Txid::GetData(&local_c10,local_af0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_bf8,&local_c10);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetData(&local_c48,&local_4d0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c30,&local_c48);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_bd8,"dest.txid.GetData().GetHex().c_str()",
             "utxo1.txid.GetData().GetHex().c_str()",pcVar4,rhs);
  std::__cxx11::string::~string((string *)&local_c30);
  cfd::core::ByteData::~ByteData((ByteData *)0x288184);
  std::__cxx11::string::~string((string *)&local_bf8);
  cfd::core::ByteData::~ByteData((ByteData *)0x28819e);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_bd8);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_c50);
    in_stack_fffffffffffff330 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x288299);
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3b,(char *)in_stack_fffffffffffff330);
    testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    testing::Message::~Message((Message *)0x2882f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x28834b);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffff338),(char *)in_stack_fffffffffffff330,
             (uint *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (uint *)in_stack_fffffffffffff320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c70);
    in_stack_fffffffffffff320 =
         (UtxoData *)testing::AssertionResult::failure_message((AssertionResult *)0x2883de);
    testing::internal::AssertHelper::AssertHelper
              (&local_c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3c,(char *)in_stack_fffffffffffff320);
    testing::internal::AssertHelper::operator=(&local_c78,&local_c70);
    testing::internal::AssertHelper::~AssertHelper(&local_c78);
    testing::Message::~Message((Message *)0x28842c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x28847b);
  cfd::UtxoData::~UtxoData(in_stack_fffffffffffff320);
  cfd::UtxoData::~UtxoData(in_stack_fffffffffffff320);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo)
{
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;

  Utxo utxo;
  memset(&utxo, 0, sizeof(utxo));
  UtxoData dest;

  EXPECT_NO_THROW((UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)));
  EXPECT_TRUE((memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0));
  EXPECT_EQ(utxo.vout, utxo1.vout);
  EXPECT_STREQ(dest.txid.GetData().GetHex().c_str(),
               utxo1.txid.GetData().GetHex().c_str());
  EXPECT_EQ(dest.vout, utxo1.vout);
}